

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O3

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer pMVar5;
  Mat *pMVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  int iVar11;
  float *pfVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  float *pfVar16;
  long lVar17;
  int iVar18;
  int k;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  undefined1 auVar25 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = pMVar5->w;
  uVar1 = pMVar5->h;
  iVar18 = this->image_width;
  iVar21 = this->image_height;
  if ((iVar21 == -0xe9 && iVar18 == -0xe9) &&
      (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar5 == 0x48) {
    if (((this->max_sizes).data == (void *)0x0) ||
       ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)) {
      fVar28 = this->step_width;
      fVar24 = this->step_height;
      uVar2 = (this->min_sizes).w;
      uVar3 = (this->aspect_ratios).w;
      iVar21 = uVar2 + uVar3 + -1;
      pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar6,iVar15 * uVar1 * iVar21 * 4,4,opt->blob_allocator);
      pvVar7 = pMVar6->data;
      if (pvVar7 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar6->c * pMVar6->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar1) {
        fVar23 = 1.0 / (float)iVar15;
        uVar22 = -(uint)(fVar28 == -233.0);
        fVar28 = (float)(~uVar22 & (uint)fVar28 | uVar22 & (uint)fVar23);
        uVar22 = -(uint)(fVar24 == -233.0);
        fVar29 = (float)(int)uVar1 * 0.5;
        pfVar12 = (float *)(this->min_sizes).data;
        uVar14 = 0;
        do {
          if (0 < iVar15) {
            fVar30 = ((float)(int)uVar14 + this->offset) *
                     (float)(~uVar22 & (uint)fVar24 | (uint)(1.0 / (float)(int)uVar1) & uVar22);
            fVar31 = this->offset * fVar28;
            pfVar16 = (float *)((long)pvVar7 + (long)(iVar21 * iVar15 * 4 * (int)uVar14) * 4);
            pvVar8 = (this->min_sizes).data;
            pvVar9 = (this->aspect_ratios).data;
            iVar18 = 0;
            do {
              if (0 < (int)uVar2) {
                uVar19 = 0;
                do {
                  fVar33 = *(float *)((long)pvVar8 + uVar19 * 4);
                  fVar34 = fVar29 * fVar33 * fVar23;
                  fVar33 = fVar33 * 0.5;
                  *pfVar16 = fVar31 - fVar34;
                  pfVar16[1] = fVar30 - fVar33;
                  pfVar16[2] = fVar31 + fVar34;
                  pfVar16[3] = fVar30 + fVar33;
                  pfVar16 = pfVar16 + 4;
                  uVar19 = uVar19 + 1;
                } while (uVar2 != uVar19);
              }
              if (1 < (int)uVar3) {
                fVar33 = *pfVar12;
                uVar19 = 1;
                do {
                  fVar34 = SQRT(*(float *)((long)pvVar9 + uVar19 * 4));
                  fVar35 = fVar29 * fVar33 * fVar23 * fVar34;
                  fVar34 = (fVar33 * 0.5) / fVar34;
                  *pfVar16 = fVar31 - fVar35;
                  pfVar16[1] = fVar30 - fVar34;
                  pfVar16[2] = fVar31 + fVar35;
                  pfVar16[3] = fVar30 + fVar34;
                  pfVar16 = pfVar16 + 4;
                  uVar19 = uVar19 + 1;
                } while (uVar3 != uVar19);
              }
              fVar31 = fVar31 + fVar28;
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar15);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar1);
      }
      if (this->clip == 0) {
        return 0;
      }
      iVar15 = pMVar6->w;
      if ((long)iVar15 < 1) {
        return 0;
      }
      lVar17 = 0;
      do {
        fVar28 = *(float *)((long)pvVar7 + lVar17 * 4);
        if (fVar28 <= 0.0) {
          fVar28 = 0.0;
        }
        if (1.0 <= fVar28) {
          fVar28 = 1.0;
        }
        *(float *)((long)pvVar7 + lVar17 * 4) = fVar28;
        lVar17 = lVar17 + 1;
      } while (iVar15 != lVar17);
      return 0;
    }
  }
  else if (iVar18 != -0xe9) goto LAB_004181e6;
  iVar18 = pMVar5[1].w;
LAB_004181e6:
  if (iVar21 == -0xe9) {
    iVar21 = pMVar5[1].h;
  }
  fVar28 = this->step_width;
  fVar24 = this->step_height;
  if ((fVar28 == -233.0) && (fVar28 = (float)iVar18 / (float)iVar15, this->step_mmdetection == true)
     ) {
    fVar28 = ceilf(fVar28);
  }
  if ((fVar24 == -233.0) &&
     (fVar24 = (float)iVar21 / (float)(int)uVar1, this->step_mmdetection == true)) {
    fVar24 = ceilf(fVar24);
  }
  uVar2 = (this->min_sizes).w;
  iVar4 = (this->max_sizes).w;
  uVar3 = (this->aspect_ratios).w;
  iVar13 = this->flip;
  if (this->flip != 0) {
    iVar13 = uVar3 * uVar2;
  }
  iVar13 = uVar3 * uVar2 + iVar4 + uVar2 + iVar13;
  pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar6,iVar15 * uVar1 * iVar13 * 4,2,4,opt->blob_allocator);
  pvVar7 = pMVar6->data;
  iVar11 = -100;
  if ((pvVar7 != (void *)0x0) && ((long)pMVar6->c * pMVar6->cstep != 0)) {
    if (0 < (int)uVar1) {
      fVar23 = fVar28;
      fVar29 = fVar24;
      if (this->center_mmdetection != false) {
        fVar23 = fVar28 + -1.0;
        fVar29 = fVar24 + -1.0;
      }
      auVar25._0_8_ = CONCAT44((float)iVar21,(float)iVar18);
      auVar25._8_8_ = auVar25._0_8_;
      auVar25 = divps(_DAT_005a6b10,auVar25);
      uVar14 = 0;
      do {
        if (0 < iVar15) {
          fVar31 = fVar29 * this->offset + (float)(int)uVar14 * fVar24;
          fVar30 = this->offset * fVar23;
          pfVar12 = (float *)((long)pvVar7 + (long)(iVar13 * iVar15 * 4 * (int)uVar14) * 4);
          pvVar8 = (this->min_sizes).data;
          iVar21 = 0;
          do {
            if (0 < (int)uVar2) {
              pvVar9 = (this->max_sizes).data;
              pvVar10 = (this->aspect_ratios).data;
              iVar18 = this->flip;
              uVar19 = 0;
              do {
                fVar33 = *(float *)((long)pvVar8 + uVar19 * 4);
                fVar32 = fVar33 * 0.5;
                fVar34 = auVar25._0_4_;
                fVar35 = auVar25._4_4_;
                fVar26 = auVar25._8_4_;
                fVar27 = auVar25._12_4_;
                *pfVar12 = (fVar30 - fVar32) * fVar34;
                pfVar12[1] = (fVar31 - fVar32) * fVar35;
                pfVar12[2] = (fVar32 + fVar30) * fVar26;
                pfVar12[3] = (fVar32 + fVar31) * fVar27;
                if (iVar4 < 1) {
                  pfVar12 = pfVar12 + 4;
                }
                else {
                  fVar33 = SQRT(fVar33 * *(float *)((long)pvVar9 + uVar19 * 4)) * 0.5;
                  pfVar12[4] = (fVar30 - fVar33) * fVar34;
                  pfVar12[5] = (fVar31 - fVar33) * fVar35;
                  pfVar12[6] = (fVar33 + fVar30) * fVar26;
                  pfVar12[7] = (fVar33 + fVar31) * fVar27;
                  pfVar12 = pfVar12 + 8;
                }
                if (0 < (int)uVar3) {
                  uVar20 = 0;
                  do {
                    fVar36 = SQRT(*(float *)((long)pvVar10 + uVar20 * 4));
                    fVar33 = fVar32 * fVar36;
                    fVar36 = fVar32 / fVar36;
                    *pfVar12 = (fVar30 - fVar33) * fVar34;
                    pfVar12[1] = (fVar31 - fVar36) * fVar35;
                    pfVar12[2] = (fVar30 + fVar33) * fVar26;
                    pfVar12[3] = (fVar31 + fVar36) * fVar27;
                    if (iVar18 == 0) {
                      pfVar12 = pfVar12 + 4;
                    }
                    else {
                      pfVar12[4] = (fVar30 - fVar36) * fVar34;
                      pfVar12[5] = (fVar31 - fVar33) * fVar35;
                      pfVar12[6] = (fVar30 + fVar36) * fVar26;
                      pfVar12[7] = (fVar31 + fVar33) * fVar27;
                      pfVar12 = pfVar12 + 8;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar3 != uVar20);
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar2);
            }
            fVar30 = fVar30 + fVar28;
            iVar21 = iVar21 + 1;
          } while (iVar21 != iVar15);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar1);
    }
    uVar1 = pMVar6->w;
    if (this->clip != 0) {
      uVar14 = 0;
      if ((int)uVar1 < 1) {
        return 0;
      }
      do {
        fVar28 = *(float *)((long)pvVar7 + uVar14 * 4);
        if (fVar28 <= 0.0) {
          fVar28 = 0.0;
        }
        if (1.0 <= fVar28) {
          fVar28 = 1.0;
        }
        *(float *)((long)pvVar7 + uVar14 * 4) = fVar28;
        uVar14 = uVar14 + 1;
      } while (uVar1 != uVar14);
    }
    uVar2 = uVar1 + 3;
    if (-1 < (int)uVar1) {
      uVar2 = uVar1;
    }
    iVar11 = 0;
    if (3 < (int)uVar1) {
      iVar15 = (int)uVar2 >> 2;
      pfVar12 = (float *)((long)pvVar7 + (ulong)uVar1 * pMVar6->elemsize);
      do {
        *pfVar12 = this->variances[0];
        pfVar12[1] = this->variances[1];
        pfVar12[2] = this->variances[2];
        pfVar12[3] = this->variances[3];
        pfVar12 = pfVar12 + 4;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
  }
  return iVar11;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = sqrtf(aspect_ratios[p]);
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
    {
        step_w = (float)image_w / w;
        if (step_mmdetection)
            step_w = ceilf((float)image_w / w);
    }
    if (step_h == -233)
    {
        step_h = (float)image_h / h;
        if (step_mmdetection)
            step_h = ceilf((float)image_h / h);
    }

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;
        if (center_mmdetection)
        {
            center_x = offset * (step_w - 1);
            center_y = offset * (step_h - 1) + i * step_h;
        }

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrtf(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrtf(ar);
                    box_h = min_size / sqrtf(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}